

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_defines.hpp
# Opt level: O2

shared_ptr<chaiscript::dispatch::Proxy_Function_Base> __thiscall
chaiscript::
make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Dynamic_Proxy_Function_Impl<chaiscript::Boxed_Value(*)(chaiscript::Function_Params_const&)>,chaiscript::Boxed_Value(*)(chaiscript::Function_Params_const&)>
          (chaiscript *this,_func_Boxed_Value_Function_Params_ptr **arg)

{
  _func_Boxed_Value_Function_Params_ptr *t_f;
  Dynamic_Proxy_Function_Impl<chaiscript::Boxed_Value_(*)(const_chaiscript::Function_Params_&)>
  *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> sVar2;
  __uniq_ptr_impl<chaiscript::AST_Node,_std::default_delete<chaiscript::AST_Node>_> local_70;
  shared_ptr<chaiscript::AST_Node> local_68;
  Proxy_Function local_58;
  Param_Types local_48;
  
  this_00 = (Dynamic_Proxy_Function_Impl<chaiscript::Boxed_Value_(*)(const_chaiscript::Function_Params_&)>
             *)operator_new(0x70);
  t_f = *arg;
  local_70._M_t.
  super__Tuple_impl<0UL,_chaiscript::AST_Node_*,_std::default_delete<chaiscript::AST_Node>_>.
  super__Head_base<0UL,_chaiscript::AST_Node_*,_false>._M_head_impl =
       (tuple<chaiscript::AST_Node_*,_std::default_delete<chaiscript::AST_Node>_>)
       (_Tuple_impl<0UL,_chaiscript::AST_Node_*,_std::default_delete<chaiscript::AST_Node>_>)0x0;
  std::__shared_ptr<chaiscript::AST_Node,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chaiscript::AST_Node,std::default_delete<chaiscript::AST_Node>,void>
            ((__shared_ptr<chaiscript::AST_Node,(__gnu_cxx::_Lock_policy)2> *)&local_68,
             (unique_ptr<chaiscript::AST_Node,_std::default_delete<chaiscript::AST_Node>_> *)
             &local_70);
  local_48.m_types.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_48._17_8_ = 0;
  local_48.m_types.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.m_types.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_48.m_types.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_58.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_58.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::
  Dynamic_Proxy_Function_Impl<chaiscript::Boxed_Value_(*)(const_chaiscript::Function_Params_&)>::
  Dynamic_Proxy_Function_Impl(this_00,t_f,-1,&local_68,&local_48,&local_58);
  std::__shared_ptr<chaiscript::dispatch::Proxy_Function_Base,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chaiscript::dispatch::Proxy_Function_Base,void>
            ((__shared_ptr<chaiscript::dispatch::Proxy_Function_Base,(__gnu_cxx::_Lock_policy)2> *)
             this,(Proxy_Function_Base *)this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ::~vector(&local_48.m_types);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  _Var1._M_pi = extraout_RDX;
  if (local_70._M_t.
      super__Tuple_impl<0UL,_chaiscript::AST_Node_*,_std::default_delete<chaiscript::AST_Node>_>.
      super__Head_base<0UL,_chaiscript::AST_Node_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_chaiscript::AST_Node_*,_std::default_delete<chaiscript::AST_Node>_>)0x0) {
    (**(code **)(*(long *)local_70._M_t.
                          super__Tuple_impl<0UL,_chaiscript::AST_Node_*,_std::default_delete<chaiscript::AST_Node>_>
                          .super__Head_base<0UL,_chaiscript::AST_Node_*,_false>._M_head_impl + 0x18)
    )();
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  sVar2.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<chaiscript::dispatch::Proxy_Function_Base>)
         sVar2.
         super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<B> make_shared(Arg &&...arg) {
#ifdef CHAISCRIPT_USE_STD_MAKE_SHARED
    return std::make_shared<D>(std::forward<Arg>(arg)...);
#else
    return std::shared_ptr<B>(static_cast<B *>(new D(std::forward<Arg>(arg)...)));
#endif
  }